

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddAuto.c
# Opt level: O2

DdNode ** Extra_bddSpaceExorGates(DdManager *dd,DdNode *bFuncRed,DdNode *zEquations)

{
  int iVar1;
  int *support;
  DdNode **ppDVar2;
  DdNode *n;
  DdNode *n_00;
  DdNode *pDVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  bool bVar7;
  
  iVar1 = dd->size;
  if (dd->size < dd->sizeZ) {
    iVar1 = dd->sizeZ;
  }
  support = (int *)malloc((long)iVar1 << 2);
  Extra_SupportArray(dd,bFuncRed,support);
  ppDVar2 = (DdNode **)calloc(1,(long)dd->size << 3);
  Cudd_Ref(zEquations);
  do {
    if (zEquations == dd->zero) {
      Cudd_RecursiveDerefZdd(dd,zEquations);
      free(support);
      return ppDVar2;
    }
    n = Extra_zddSelectOneSubset(dd,zEquations);
    Cudd_Ref(n);
    n_00 = Cudd_zddDiff(dd,zEquations,n);
    Cudd_Ref(n_00);
    Cudd_RecursiveDerefZdd(dd,zEquations);
    uVar6 = 0xffffffff;
    for (pDVar3 = n; uVar5 = (uint)uVar6, pDVar3 != dd->one; pDVar3 = (pDVar3->type).kids.T) {
      uVar4 = pDVar3->index >> 1;
      if ((support[uVar4] == 1) && (bVar7 = uVar5 != 0xffffffff, uVar5 = uVar4, bVar7)) {
        __assert_fail("iVarNonCan == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/extrab/extraBddAuto.c"
                      ,0x211,"DdNode **Extra_bddSpaceExorGates(DdManager *, DdNode *, DdNode *)");
      }
      uVar6 = (ulong)uVar5;
    }
    if (uVar5 == 0xffffffff) {
      __assert_fail("iVarNonCan != -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/extrab/extraBddAuto.c"
                    ,0x215,"DdNode **Extra_bddSpaceExorGates(DdManager *, DdNode *, DdNode *)");
    }
    iVar1 = Extra_zddLitCountComb(dd,n);
    zEquations = n_00;
    if (iVar1 < 2) {
      Cudd_RecursiveDerefZdd(dd,n);
    }
    else {
      ppDVar2[uVar6] = n;
    }
  } while( true );
}

Assistant:

DdNode ** Extra_bddSpaceExorGates( DdManager * dd, DdNode * bFuncRed, DdNode * zEquations )
{
    DdNode ** pzRes;
    int * pVarsNonCan;
    DdNode * zEquRem;
    int iVarNonCan;
    DdNode * zExor, * zTemp;

    // get the set of non-canonical variables
    pVarsNonCan = ABC_ALLOC( int, ddMax(dd->size,dd->sizeZ) );
    Extra_SupportArray( dd, bFuncRed, pVarsNonCan );

    // allocate storage for the EXOR sets
    pzRes = ABC_ALLOC( DdNode *, dd->size );
    memset( pzRes, 0, sizeof(DdNode *) * dd->size );

    // go through all the equations
    zEquRem = zEquations;  Cudd_Ref( zEquRem );
    while ( zEquRem != z0 )
    {
        // extract one product
        zExor = Extra_zddSelectOneSubset( dd, zEquRem );   Cudd_Ref( zExor );
        // remove it from the set
        zEquRem = Cudd_zddDiff( dd, zTemp = zEquRem, zExor );  Cudd_Ref( zEquRem );
        Cudd_RecursiveDerefZdd( dd, zTemp );

        // locate the non-canonical variable
        iVarNonCan = -1;
        for ( zTemp = zExor; zTemp != z1; zTemp = cuddT(zTemp) )
        {
            if ( pVarsNonCan[zTemp->index/2] == 1 )
            {
                assert( iVarNonCan == -1 );
                iVarNonCan = zTemp->index/2;
            }
        }
        assert( iVarNonCan != -1 );

        if ( Extra_zddLitCountComb( dd, zExor ) > 1 )
            pzRes[ iVarNonCan ] = zExor; // takes ref
        else
            Cudd_RecursiveDerefZdd( dd, zExor );
    }
    Cudd_RecursiveDerefZdd( dd, zEquRem );

    ABC_FREE( pVarsNonCan );
    return pzRes;
}